

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form_test.cpp
# Opt level: O2

void __thiscall unit_test::main(unit_test *this,string *a_case)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  ostream *poVar7;
  ostream *poVar8;
  undefined8 uVar9;
  ostream *poVar10;
  uint uVar11;
  char *pcVar12;
  form X;
  vector<bool,_std::allocator<bool>_> v;
  undefined4 uStack_292c;
  char_type *local_2928;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2920 [7];
  form b;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  undefined4 uStack_287c;
  char *local_2878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2870;
  _Alloc_hider local_2860;
  size_type local_2858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2850;
  _Alloc_hider local_2840;
  size_type local_2838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2830;
  _Alloc_hider local_2820;
  size_type local_2818;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2810 [37];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  string local_25a0 [32];
  string local_2580 [32];
  string local_2560 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2540;
  form a2;
  form a;
  string local_24c0 [32];
  string local_24a0 [32];
  string local_2480 [32];
  string local_2460 [32];
  string local_2440 [32];
  string local_2420 [32];
  string local_2400 [32];
  string local_23e0 [32];
  string local_23c0 [32];
  string local_23a0 [32];
  string local_2380 [32];
  string local_2360 [32];
  string local_2340 [32];
  string local_2320 [32];
  string local_2300 [32];
  form a1;
  select_multiple select_multiple;
  select select;
  radio radio;
  numeric<double> local_1c08;
  submit submit;
  password p1;
  checkbox checkbox;
  password p2;
  text text;
  undefined1 local_f18 [600];
  textarea textarea;
  numeric<int> integer;
  file file;
  regex_field regex;
  email email;
  
  cppcms::widgets::text::text(&text);
  cppcms::widgets::textarea::textarea(&textarea);
  cppcms::widgets::numeric<int>::numeric(&integer);
  cppcms::widgets::numeric<double>::numeric(&local_1c08);
  cppcms::widgets::password::password(&p1);
  cppcms::widgets::password::password(&p2);
  std::__cxx11::string::string((string *)&submit,"^(yes|no)$",(allocator *)&ids);
  cppcms::widgets::regex_field::regex_field(&regex,(string *)&submit);
  std::__cxx11::string::~string((string *)&submit);
  cppcms::widgets::email::email(&email);
  cppcms::widgets::checkbox::checkbox(&checkbox);
  cppcms::widgets::select_multiple::select_multiple(&select_multiple);
  cppcms::widgets::select::select(&select);
  cppcms::widgets::radio::radio(&radio);
  cppcms::widgets::submit::submit(&submit);
  cppcms::widgets::file::file(&file);
  lVar1 = *(long *)(_text + -0x18);
  std::__cxx11::string::string(local_2300,"text",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&text + lVar1,local_2300);
  std::__cxx11::string::~string(local_2300);
  lVar1 = *(long *)(_textarea + -0x18);
  std::__cxx11::string::string(local_2320,"textarea",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&textarea + lVar1,local_2320);
  std::__cxx11::string::~string(local_2320);
  lVar1 = *(long *)(integer._0_8_ + -0x18);
  std::__cxx11::string::string(local_2340,"int",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&integer.super_base_html_input + lVar1,local_2340);
  std::__cxx11::string::~string(local_2340);
  lVar1 = *(long *)(local_1c08._0_8_ + -0x18);
  std::__cxx11::string::string(local_2360,"double",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&local_1c08.super_base_html_input + lVar1,local_2360);
  std::__cxx11::string::~string(local_2360);
  lVar1 = *(long *)(_p1 + -0x18);
  std::__cxx11::string::string(local_2380,"pass",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&p1 + lVar1,local_2380);
  std::__cxx11::string::~string(local_2380);
  lVar1 = *(long *)(_p2 + -0x18);
  std::__cxx11::string::string(local_23a0,"pass2",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&p2 + lVar1,local_23a0);
  std::__cxx11::string::~string(local_23a0);
  lVar1 = *(long *)(_regex + -0x18);
  std::__cxx11::string::string(local_23c0,"yes or not",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&regex + lVar1,local_23c0);
  std::__cxx11::string::~string(local_23c0);
  lVar1 = *(long *)(_email + -0x18);
  std::__cxx11::string::string(local_23e0,"E-Mail",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&email + lVar1,local_23e0);
  std::__cxx11::string::~string(local_23e0);
  lVar1 = *(long *)(_checkbox + -0x18);
  std::__cxx11::string::string(local_2400,"Checkbox",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&checkbox + lVar1,local_2400);
  std::__cxx11::string::~string(local_2400);
  std::__cxx11::string::string(local_2420,"Select Multiple",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&select_multiple,local_2420);
  std::__cxx11::string::~string(local_2420);
  std::__cxx11::string::string(local_2440,"Select",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&select,local_2440);
  std::__cxx11::string::~string(local_2440);
  std::__cxx11::string::string(local_2460,"Radio",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&radio,local_2460);
  std::__cxx11::string::~string(local_2460);
  lVar1 = *(long *)(_submit + -0x18);
  std::__cxx11::string::string(local_2480,"Submit",(allocator *)&ids);
  cppcms::widgets::base_widget::message(&submit + lVar1,local_2480);
  std::__cxx11::string::~string(local_2480);
  std::__cxx11::string::string(local_24a0,"Button",(allocator *)&ids);
  cppcms::widgets::submit::value(&submit,local_24a0);
  std::__cxx11::string::~string(local_24a0);
  std::__cxx11::string::string((string *)&ids,"a",(allocator *)&v);
  cppcms::widgets::select_multiple::add((string *)&select_multiple,SUB81(&ids,0));
  std::__cxx11::string::~string((string *)&ids);
  std::__cxx11::string::string((string *)&ids,"b",(allocator *)&v);
  cppcms::widgets::select_multiple::add((string *)&select_multiple,SUB81(&ids,0));
  std::__cxx11::string::~string((string *)&ids);
  std::__cxx11::string::string((string *)&ids,"c",(allocator *)&v);
  cppcms::widgets::select_multiple::add((string *)&select_multiple,SUB81(&ids,0));
  std::__cxx11::string::~string((string *)&ids);
  _ids = 0;
  local_2878 = "tr1";
  local_2870._M_allocated_capacity = 0;
  local_2870._8_8_ = (char_type *)0x0;
  local_2858 = 0;
  local_2850._M_local_buf[0] = '\0';
  local_2838 = 0;
  local_2830._M_local_buf[0] = '\0';
  local_2818 = 0;
  local_2810[0]._M_local_buf[0] = '\0';
  local_2860._M_p = (pointer)&local_2850;
  local_2840._M_p = (pointer)&local_2830;
  local_2820._M_p = (pointer)local_2810;
  std::__cxx11::string::string((string *)&v,"id1",(allocator *)&X);
  cppcms::widgets::select_multiple::add
            ((basic_message *)&select_multiple,(string *)&ids,SUB81(&v,0));
  std::__cxx11::string::~string((string *)&v);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ids);
  std::__cxx11::string::string((string *)&ids,"a",(allocator *)&v);
  cppcms::widgets::select_base::add((string *)&select);
  std::__cxx11::string::~string((string *)&ids);
  std::__cxx11::string::string((string *)&ids,"b",(allocator *)&v);
  cppcms::widgets::select_base::add((string *)&select);
  std::__cxx11::string::~string((string *)&ids);
  std::__cxx11::string::string((string *)&ids,"c",(allocator *)&v);
  cppcms::widgets::select_base::add((string *)&select);
  std::__cxx11::string::~string((string *)&ids);
  _ids = 0;
  local_2878 = "tr2";
  local_2870._M_allocated_capacity = 0;
  local_2870._8_8_ = (char_type *)0x0;
  local_2858 = 0;
  local_2850._M_local_buf[0] = '\0';
  local_2838 = 0;
  local_2830._M_local_buf[0] = '\0';
  local_2818 = 0;
  local_2810[0]._M_local_buf[0] = '\0';
  local_2860._M_p = (pointer)&local_2850;
  local_2840._M_p = (pointer)&local_2830;
  local_2820._M_p = (pointer)local_2810;
  std::__cxx11::string::string((string *)&v,"id2",(allocator *)&X);
  cppcms::widgets::select_base::add((basic_message *)&select,(string *)&ids);
  std::__cxx11::string::~string((string *)&v);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ids);
  std::__cxx11::string::string(local_24c0,"id2",(allocator *)&ids);
  cppcms::widgets::select_base::selected_id(&select,local_24c0);
  std::__cxx11::string::~string(local_24c0);
  std::__cxx11::string::string((string *)&ids,"x",(allocator *)&v);
  cppcms::widgets::select_base::add((string *)&radio);
  std::__cxx11::string::~string((string *)&ids);
  std::__cxx11::string::string((string *)&ids,"y",(allocator *)&v);
  cppcms::widgets::select_base::add((string *)&radio);
  std::__cxx11::string::~string((string *)&ids);
  _ids = 0;
  local_2878 = "tr3";
  local_2870._M_allocated_capacity = 0;
  local_2870._8_8_ = (_Rb_tree_node_base *)0x0;
  local_2858 = 0;
  local_2850._M_local_buf[0] = '\0';
  local_2838 = 0;
  local_2830._M_local_buf[0] = '\0';
  local_2818 = 0;
  local_2810[0]._M_local_buf[0] = '\0';
  local_2860._M_p = (pointer)&local_2850;
  local_2840._M_p = (pointer)&local_2830;
  local_2820._M_p = (pointer)local_2810;
  std::__cxx11::string::string((string *)&v,"id3",(allocator *)&X);
  cppcms::widgets::select_base::add((basic_message *)&radio,(string *)&ids);
  std::__cxx11::string::~string((string *)&v);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ids);
  cppcms::widgets::select_base::selected((int)&radio);
  cppcms::form::form(&X);
  cppcms::form::form(&a);
  cppcms::form::form(&a1);
  cppcms::form::form(&a2);
  cppcms::form::form(&b);
  if (a_case->_M_string_length != 0) {
    bVar3 = std::operator==(a_case,"/non_empty");
    if (!bVar3) {
      bVar3 = std::operator==(a_case,"/sub");
      if (!bVar3) {
        bVar3 = std::operator==(a_case,"/text");
        if (bVar3) {
          cppcms::form::add((base_widget *)&X);
          cppcms::widgets::base_text::limits((int)local_f18,2);
          load(this,&X);
          cVar4 = cppcms::widgets::base_widget::set();
          if (cVar4 == '\0') goto LAB_0010b1ba;
          cppcms::application::response();
          poVar7 = (ostream *)cppcms::http::response::out();
          cppcms::widgets::base_text::value_abi_cxx11_();
          std::operator<<(poVar7,(string *)&ids);
          goto LAB_0010b165;
        }
        bVar3 = std::operator==(a_case,"/number");
        if (bVar3) {
          cppcms::form::add((base_widget *)&X);
          local_1c08.check_low_ = true;
          local_1c08.check_high_ = true;
          local_1c08.min_ = 5.0;
          local_1c08.max_ = 100.0;
          local_1c08.non_empty_ = true;
          load(this,&X);
          cVar4 = cppcms::widgets::base_widget::set();
          if (cVar4 != '\0') {
            cppcms::application::response();
            cppcms::http::response::out();
            dVar2 = cppcms::widgets::numeric<double>::value(&local_1c08);
            std::ostream::_M_insert<double>(dVar2);
          }
          goto LAB_0010b1ba;
        }
        bVar3 = std::operator==(a_case,"/pass");
        if (bVar3) {
          cppcms::form::add((base_widget *)&X);
          cppcms::form::add((base_widget *)&X);
          cppcms::widgets::base_text::non_empty();
          cppcms::widgets::password::check_equal(&p2);
LAB_0010b3ce:
          load(this,&X);
          goto LAB_0010b1ba;
        }
        bVar3 = std::operator==(a_case,"/checkbox");
        if (bVar3) {
          cppcms::form::add((base_widget *)&X);
          load(this,&X);
          cppcms::application::response();
          uVar5 = cppcms::http::response::out();
          cppcms::widgets::checkbox::value();
LAB_0010b438:
          std::ostream::_M_insert<bool>((bool)uVar5);
        }
        else {
          bVar3 = std::operator==(a_case,"/sm");
          if (bVar3) {
            cppcms::form::add((base_widget *)&X);
            cppcms::widgets::select_multiple::non_empty();
            cppcms::widgets::select_multiple::at_most((uint)&select_multiple);
            load(this,&X);
            cppcms::application::response();
            poVar7 = (ostream *)cppcms::http::response::out();
            cppcms::widgets::select_multiple::selected_map();
            for (uVar11 = 0;
                (ulong)uVar11 <
                (local_2920[0]._8_8_ & 0xffffffff) +
                (local_2920[0]._M_allocated_capacity - CONCAT44(uStack_292c,_v)) * 8;
                uVar11 = uVar11 + 1) {
              std::vector<bool,_std::allocator<bool>_>::operator[](&v,(ulong)uVar11);
              poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
              std::operator<<(poVar8," ");
            }
            std::endl<char,std::char_traits<char>>(poVar7);
            cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
            for (uVar9 = local_2870._8_8_;
                (_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)&local_2878;
                uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
              poVar8 = std::operator<<(poVar7,(string *)(uVar9 + 0x20));
              std::operator<<(poVar8," ");
            }
            std::endl<char,std::char_traits<char>>(poVar7);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&ids);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      ((_Bvector_base<std::allocator<bool>_> *)&v);
            goto LAB_0010b1ba;
          }
          bVar3 = std::operator==(a_case,"/select");
          if (bVar3) {
            cppcms::form::add((base_widget *)&X);
            cppcms::widgets::select_base::non_empty();
            load(this,&X);
            cppcms::application::response();
            poVar10 = (ostream *)cppcms::http::response::out();
            iVar6 = cppcms::widgets::select_base::selected();
            poVar7 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
            poVar7 = std::operator<<(poVar7," ");
            cppcms::widgets::select_base::selected_id_abi_cxx11_();
            std::operator<<(poVar7,(string *)&ids);
          }
          else {
            bVar3 = std::operator==(a_case,"/radio");
            if (!bVar3) {
              bVar3 = std::operator==(a_case,"/submit");
              if (!bVar3) {
                bVar3 = std::operator==(a_case,"/submitl");
                if (bVar3) {
                  cppcms::widgets::submit::submit((submit *)&ids);
                  lVar1 = *(long *)(CONCAT44(uStack_287c,_ids) + -0x18);
                  std::__cxx11::string::string(local_2560,"submit_id",(allocator *)&v);
                  cppcms::widgets::base_widget::id(&ids + lVar1,local_2560);
                  std::__cxx11::string::~string(local_2560);
                  lVar1 = *(long *)(CONCAT44(uStack_287c,_ids) + -0x18);
                  std::__cxx11::string::string(local_2580,"submit_name",(allocator *)&v);
                  cppcms::widgets::base_widget::name(&ids + lVar1,local_2580);
                  std::__cxx11::string::~string(local_2580);
                  _v = 0;
                  cppcms::widgets::base_widget::help
                            ((basic_message *)
                             ((submit *)&ids + *(long *)(CONCAT44(uStack_287c,_ids) + -0x18)));
                  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&v);
                  _v = 0;
                  cppcms::widgets::base_widget::error_message
                            ((basic_message *)
                             ((submit *)&ids + *(long *)(CONCAT44(uStack_287c,_ids) + -0x18)));
                  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&v);
                  _v = 0;
                  cppcms::widgets::base_widget::message
                            ((basic_message *)
                             ((submit *)&ids + *(long *)(CONCAT44(uStack_287c,_ids) + -0x18)));
                  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&v);
                  cppcms::widgets::base_widget::valid
                            ((bool)((char)(submit *)&ids +
                                   (char)*(undefined8 *)(CONCAT44(uStack_287c,_ids) + -0x18)));
                  _v = 0;
                  cppcms::widgets::submit::value((basic_message *)&ids);
                  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&v);
                  cppcms::form::add((base_widget *)&X);
                  cppcms::application::response();
                  uVar9 = cppcms::http::response::out();
                  cppcms::form_context::form_context((form_context *)&v,uVar9,0,0);
                  cppcms::form::render((form_context *)&X);
                  cppcms::form_context::~form_context((form_context *)&v);
                  cppcms::widgets::submit::~submit((submit *)&ids);
                  goto LAB_0010b1ba;
                }
                bVar3 = std::operator==(a_case,"/upload");
                if (!bVar3) {
                  bVar3 = std::operator==(a_case,"/upload_regex");
                  if (!bVar3) goto LAB_0010b1ba;
                }
                cppcms::widgets::file::non_empty();
                lVar1 = *(long *)(_file + -0x18);
                std::__cxx11::string::string(local_25a0,"file",(allocator *)&ids);
                cppcms::widgets::base_widget::name(&file + lVar1);
                std::__cxx11::string::~string(local_25a0);
                cppcms::widgets::file::limits((int)&file,0);
                bVar3 = std::operator==(a_case,"/upload");
                if (bVar3) {
                  std::__cxx11::string::string((string *)&ids,"text/plain",(allocator *)&v);
                  cppcms::widgets::file::mime((string *)&file);
                }
                else {
                  std::__cxx11::string::string
                            ((string *)&ids,"^text/(html|plain)$",(allocator *)&local_25c0);
                  booster::regex::regex((regex *)&v,(string *)&ids,0);
                  cppcms::widgets::file::mime((regex *)&file);
                  booster::regex::~regex((regex *)&v);
                }
                std::__cxx11::string::~string((string *)&ids);
                std::__cxx11::string::string((string *)&ids,"foo",(allocator *)&v);
                cppcms::widgets::file::add_valid_magic((string *)&file);
                std::__cxx11::string::~string((string *)&ids);
                std::__cxx11::string::string((string *)&ids,"P3",(allocator *)&v);
                cppcms::widgets::file::add_valid_magic((string *)&file);
                std::__cxx11::string::~string((string *)&ids);
                cppcms::form::add((base_widget *)&X);
                goto LAB_0010b3ce;
              }
              cppcms::form::add((base_widget *)&X);
              load(this,&X);
              cppcms::application::response();
              uVar5 = cppcms::http::response::out();
              cppcms::widgets::submit::value();
              goto LAB_0010b438;
            }
            cppcms::form::add((base_widget *)&X);
            cppcms::widgets::select_base::non_empty();
            load(this,&X);
            cppcms::application::response();
            poVar10 = (ostream *)cppcms::http::response::out();
            iVar6 = cppcms::widgets::select_base::selected();
            poVar7 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
            poVar7 = std::operator<<(poVar7," ");
            cppcms::widgets::select_base::selected_id_abi_cxx11_();
            std::operator<<(poVar7,(string *)&ids);
          }
LAB_0010b165:
          std::__cxx11::string::~string((string *)&ids);
        }
        goto LAB_0010b1ba;
      }
    }
  }
  cppcms::form::add((base_widget *)&X);
  cppcms::form::add(&X);
  cppcms::form::add(&X);
  cppcms::form::add(&a);
  cppcms::form::add(&a);
  cppcms::form::add((base_widget *)&a1);
  cppcms::form::add((base_widget *)&a2);
  cppcms::form::add((base_widget *)&a2);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&b);
  cppcms::form::add((base_widget *)&X);
  cppcms::form::add((base_widget *)&X);
  cppcms::form::add((base_widget *)&X);
  if (a_case->_M_string_length != 0) {
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    integer.non_empty_ = true;
    local_1c08.non_empty_ = true;
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::select_multiple::non_empty();
    cppcms::widgets::select_base::non_empty();
    cppcms::widgets::select_base::non_empty();
  }
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)&ids);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ids,
                          "POST");
  if (bVar3) {
    std::__cxx11::string::~string((string *)&ids);
  }
  else {
    cppcms::application::request();
    cppcms::http::request::query_string_abi_cxx11_();
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&ids);
    if (local_2928 == (char_type *)0x0) {
      bVar3 = std::operator!=(a_case,"/sub");
      if (bVar3) {
        cppcms::application::response();
        poVar7 = (ostream *)cppcms::http::response::out();
        std::operator<<(poVar7,"non loaded<br>\n");
        cppcms::form_context::form_context((form_context *)&ids,poVar7,0,0);
        poVar8 = std::operator<<(poVar7,"<form action=\"");
        cppcms::application::request();
        cppcms::http::request::script_name_abi_cxx11_();
        cppcms::application::request();
        cppcms::http::request::path_info_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                       &local_25c0,&local_2540);
        poVar8 = std::operator<<(poVar8,(string *)&v);
        std::operator<<(poVar8,"\" method=\"post\" >\n");
        std::__cxx11::string::~string((string *)&v);
        std::__cxx11::string::~string((string *)&local_2540);
        std::__cxx11::string::~string((string *)&local_25c0);
        cppcms::form::render((form_context *)&X);
        std::operator<<(poVar7,"</form>\n");
      }
      else {
        cppcms::application::response();
        uVar9 = cppcms::http::response::out();
        cppcms::form_context::form_context((form_context *)&ids,uVar9,0,0);
        cppcms::form::render((form_context *)&b);
      }
      cppcms::form_context::~form_context((form_context *)&ids);
      goto LAB_0010b1ba;
    }
  }
  cppcms::application::response();
  cppcms::http::response::set_plain_text_header();
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  cppcms::application::context();
  cppcms::form::load((context *)&X);
  cVar4 = cppcms::form::validate();
  pcVar12 = "invalid";
  if (cVar4 != '\0') {
    pcVar12 = "valid";
  }
  poVar8 = std::operator<<(poVar7,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar8);
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"Text:");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"Textarea:");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"Int:");
    iVar6 = cppcms::widgets::numeric<int>::value(&integer);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    std::operator<<(poVar7,"Double:");
    dVar2 = cppcms::widgets::numeric<double>::value(&local_1c08);
    poVar8 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"p1:");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"p2:");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"regex: ");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"email: ");
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"checkbox: ");
    cppcms::widgets::checkbox::value();
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    std::operator<<(poVar7,"selected m:");
    cppcms::widgets::select_multiple::selected_map();
    for (uVar11 = 0;
        (ulong)uVar11 <
        (local_2920[0]._8_8_ & 0xffffffff) +
        (local_2920[0]._M_allocated_capacity - CONCAT44(uStack_292c,_v)) * 8; uVar11 = uVar11 + 1) {
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar8," ");
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
    std::operator<<(poVar7,"selected m ids:");
    for (uVar9 = local_2870._8_8_; (_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)&local_2878;
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      poVar8 = std::operator<<(poVar7,(string *)(uVar9 + 0x20));
      std::operator<<(poVar8," ");
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ids);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&v);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"Select: selected ");
    iVar6 = cppcms::widgets::select_base::selected();
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
    poVar8 = std::operator<<(poVar8," id=");
    cppcms::widgets::select_base::selected_id_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar8 = std::operator<<(poVar7,"Radio: selected ");
    iVar6 = cppcms::widgets::select_base::selected();
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
    poVar8 = std::operator<<(poVar8," id=");
    cppcms::widgets::select_base::selected_id_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ids);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&ids);
  }
  cVar4 = cppcms::widgets::base_widget::set();
  if (cVar4 != '\0') {
    poVar7 = std::operator<<(poVar7,"Submit pressed: ");
    cppcms::widgets::submit::value();
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::endl<char,std::char_traits<char>>(poVar7);
  }
LAB_0010b1ba:
  cppcms::form::~form(&b);
  cppcms::form::~form(&a2);
  cppcms::form::~form(&a1);
  cppcms::form::~form(&a);
  cppcms::form::~form(&X);
  cppcms::widgets::file::~file(&file);
  cppcms::widgets::submit::~submit(&submit);
  cppcms::widgets::radio::~radio(&radio);
  cppcms::widgets::select::~select(&select);
  cppcms::widgets::select_multiple::~select_multiple(&select_multiple);
  cppcms::widgets::checkbox::~checkbox(&checkbox);
  cppcms::widgets::email::~email(&email);
  cppcms::widgets::regex_field::~regex_field(&regex);
  cppcms::widgets::password::~password(&p2);
  cppcms::widgets::password::~password(&p1);
  cppcms::widgets::numeric<double>::~numeric(&local_1c08);
  cppcms::widgets::numeric<int>::~numeric(&integer);
  cppcms::widgets::textarea::~textarea(&textarea);
  cppcms::widgets::text::~text(&text);
  return;
}

Assistant:

virtual void main(std::string a_case)
	{
		cppcms::widgets::text text;
		cppcms::widgets::textarea textarea;
		cppcms::widgets::numeric<int> integer;
		cppcms::widgets::numeric<double> real;
		cppcms::widgets::password p1,p2;
		cppcms::widgets::regex_field regex("^(yes|no)$");
		cppcms::widgets::email email;
		cppcms::widgets::checkbox checkbox;
		cppcms::widgets::select_multiple select_multiple;
		cppcms::widgets::select select;
		cppcms::widgets::radio radio;
		cppcms::widgets::submit submit;
		cppcms::widgets::file file;


		text.message("text");
		textarea.message("textarea");
		integer.message("int");
		real.message("double");
		p1.message("pass");
		p2.message("pass2");
		regex.message("yes or not");
		email.message("E-Mail");
		checkbox.message("Checkbox");
		select_multiple.message("Select Multiple");
		select.message("Select");
		radio.message("Radio");
		submit.message("Submit");
		submit.value("Button");

		select_multiple.add("a",true);
		select_multiple.add("b",true);
		select_multiple.add("c");
		select_multiple.add(cppcms::locale::translate("tr1"),std::string("id1"));

		select.add("a");
		select.add("b");
		select.add("c");
		select.add(cppcms::locale::translate("tr2"),"id2");
		select.selected_id("id2");

		radio.add("x");
		radio.add("y");
		radio.add(cppcms::locale::translate("tr3"),"id3");
		radio.selected(0);

		cppcms::form X,a,a1,a2,b;

		if(a_case.empty() || a_case == "/non_empty" || a_case=="/sub"){
			X.add(text);
			X.add(a);
			X.add(b);
			a.add(a1);
			a.add(a2);
			a1.add(textarea);
			a2.add(integer);
			a2.add(real);
			b.add(p1);
			b.add(p2);
			b.add(regex);
			b.add(email);
			b.add(checkbox);
			b.add(select_multiple);
			X.add(select);
			X.add(radio);
			X.add(submit);

			if(!a_case.empty()) {
				text.non_empty();
				textarea.non_empty();
				integer.non_empty();
				real.non_empty();
				p1.non_empty();
				p2.non_empty();
				regex.non_empty();
				email.non_empty();
				select_multiple.non_empty();
				select.non_empty();
				radio.non_empty();
			}

			if(request().request_method()=="POST" || !request().query_string().empty()) {
				response().set_plain_text_header();
				std::ostream &out = response().out();
				X.load(context());
				if(X.validate()) {
					out << "valid" << std::endl;
				}
				else {
					out << "invalid" << std::endl;
				}
				if(text.set()) out << "Text:" << text.value() << std::endl;
				if(textarea.set()) out << "Textarea:" << textarea.value() << std::endl;
				if(integer.set()) out << "Int:" << integer.value() << std::endl;
				if(real.set()) out << "Double:" << real.value() << std::endl;
				if(p1.set()) out << "p1:" << p1.value() << std::endl;
				if(p2.set()) out << "p2:" << p2.value() << std::endl;
				if(regex.set()) out << "regex: " << regex.value() << std::endl;
				if(email.set()) out << "email: " << email.value() << std::endl;
				if(checkbox.set()) out << "checkbox: " << checkbox.value() << std::endl;
				if(select_multiple.set()) {
					out << "selected m:";
					std::vector<bool> v=select_multiple.selected_map();
					for(unsigned i=0;i<v.size();i++)
						out << i << " ";
					out << std::endl;
					std::set<std::string> ids=select_multiple.selected_ids();
					out << "selected m ids:";
					for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
						out << *p << " ";
					out<< std::endl;
				}
				if(select.set()) 
					out << "Select: selected " << select.selected() << " id=" << select.selected_id() << std::endl;
				if(radio.set()) 
					out << "Radio: selected " << radio.selected() << " id=" << radio.selected_id() << std::endl;
				if(submit.set())
					out << "Submit pressed: " << submit.value() << std::endl;

			} 
			else if(a_case !="/sub") {
				std::ostream &out = response().out();
				out << "non loaded<br>\n";
				cppcms::form_context context(out);
				out << "<form action=\"" << request().script_name() + request().path_info() <<  "\" method=\"post\" >\n";
				X.render(context);
				out << "</form>\n";
			}
			else { // if (a_case=="/sub")
				cppcms::form_context context(response().out());
				b.render(context);
			}


		}
		else if(a_case == "/text") {
			X.add(text);
			text.limits(2,5);
			load(X);
			if(text.set()) {
				response().out() << text.value();
			}

		}
		else if(a_case == "/number") {
			X.add(real);
			real.range(5,100);
			load(X);
			if(real.set()) {
				response().out() << real.value();
			}

		}
		else if(a_case == "/pass") {
			X.add(p1);
			X.add(p2);
			p1.non_empty();
			p2.check_equal(p1);
			load(X);
		}
		else if(a_case == "/checkbox") {
			X.add(checkbox);
			load(X);
			response().out() << checkbox.value();
		}
		else if(a_case == "/sm") {
			X.add(select_multiple);
			select_multiple.non_empty();
			select_multiple.at_most(2);
			load(X);
			std::ostream &out = response().out();
			std::vector<bool> v=select_multiple.selected_map();
			for(unsigned i=0;i<v.size();i++)
				out << v[i] << " ";
			out << std::endl;
			std::set<std::string> ids=select_multiple.selected_ids();
			for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
				out << *p << " ";
			out<< std::endl;
		}
		else if(a_case == "/select") {
			X.add(select);
			select.non_empty();
			load(X);
			response().out() << select.selected() <<" " << select.selected_id();
		}
		else if(a_case == "/radio") {
			X.add(radio);
			radio.non_empty();
			load(X);
			response().out() << radio.selected() <<" " << radio.selected_id();
		}
		else if(a_case == "/submit") {
			X.add(submit);
			load(X);
			response().out() << submit.value();
		}
		else if(a_case == "/submitl") {
			cppcms::widgets::submit s;
			s.id("submit_id");
			s.name("submit_name");
			s.help(cppcms::locale::translate("help"));
			s.error_message(cppcms::locale::translate("error"));
			s.message(cppcms::locale::translate("message"));
			s.valid(false);
			s.value(cppcms::locale::translate("test"));
			X.add(s);
			cppcms::form_context context(response().out());
			X.render(context);
		}
		else if(a_case == "/upload" || a_case== "/upload_regex" ) {
			file.non_empty();
			file.name("file");
			file.limits(0,20);
			if(a_case=="/upload")
				file.mime("text/plain");
			else
				file.mime(booster::regex("^text/(html|plain)$"));
			file.add_valid_magic("foo");
			file.add_valid_magic("P3");
			X.add(file);
			load(X);
		}
	}